

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendMessage.cpp
# Opt level: O0

bool __thiscall SendMessage::fillMe(SendMessage *this,string *message)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  string *message_local;
  SendMessage *this_local;
  
  bVar2 = std::operator!=(message,".\n");
  if (bVar2) {
    iVar1 = this->index;
    if (iVar1 == 1) {
      uVar3 = std::__cxx11::string::length();
      if ((uVar3 < 10) && (uVar3 = std::__cxx11::string::length(), 1 < uVar3)) {
        std::__cxx11::string::operator=((string *)&this->sender,(string *)message);
        this->index = this->index + 1;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_ServerOperation).statusMessage,"Receiver:");
        return true;
      }
      std::__cxx11::string::operator=
                ((string *)&(this->super_ServerOperation).statusMessage,
                 "Invalid Sender - MIN 1 Character and MAX 8 Characters!!!");
      this_local._7_1_ = false;
    }
    else if (iVar1 == 2) {
      uVar3 = std::__cxx11::string::length();
      if ((uVar3 < 10) && (uVar3 = std::__cxx11::string::length(), 1 < uVar3)) {
        std::__cxx11::string::operator=((string *)&this->receiver,(string *)message);
        this->index = this->index + 1;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_ServerOperation).statusMessage,"Subject:");
        return true;
      }
      std::__cxx11::string::operator=
                ((string *)&(this->super_ServerOperation).statusMessage,
                 "Invalid Receiver - Min 1 Character andi Max 8 Characters");
      this_local._7_1_ = false;
    }
    else if (iVar1 == 3) {
      uVar3 = std::__cxx11::string::length();
      if (uVar3 < 0x52) {
        std::__cxx11::string::operator=((string *)&this->subject,(string *)message);
        this->index = this->index + 1;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_ServerOperation).statusMessage,"Message-Line:");
        this_local._7_1_ = true;
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)&(this->super_ServerOperation).statusMessage,
                   "Invalid Subject - Max 80 Characters!");
        this_local._7_1_ = false;
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)&this->message_final,(string *)message);
      this_local._7_1_ = true;
    }
  }
  else if (this->index == 4) {
    std::__cxx11::string::operator=
              ((string *)&(this->super_ServerOperation).statusMessage,
               (this->super_ServerOperation).EXECUTEPENDING);
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&(this->super_ServerOperation).statusMessage,
               "Invalid Input - Operation cancelled!");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SendMessage::fillMe(string message) {
    ///check if the input from client is just a . and \n, if yes - the input from user is finished
    if(message != ".\n"){
        switch(index){
            case 1:
                ///first information for the server is the username, which is the sender
                if(message.length() <= 9 && message.length() > 1){
                    sender = message;
                    index ++;
                    ///give the client the information about the next required input.
                    statusMessage = "Receiver:";
                    return true;
                }
                ///if the input is not valid - return false and give the client information about required form for the input.
                statusMessage = "Invalid Sender - MIN 1 Character and MAX 8 Characters!!!";
                return false;
            case 2:
                ///second information the server needs is the username from the receiver
                if(message.length() <= 9 && message.length() > 1){
                    receiver = message;
                    index ++;
                    statusMessage = "Subject:";
                    return true;
                }
                statusMessage = "Invalid Receiver - Min 1 Character andi Max 8 Characters";
                return false;
            case 3:
                ///check if the 3rd input is correct, has to be the subject and not longer as 80 characters
                if(message.length() <= 81){
                    subject = message;
                    index ++;
                    statusMessage = "Message-Line:";
                    return true;
                }
                 statusMessage = "Invalid Subject - Max 80 Characters!";
                return false;
            default:
                ///the last input is the message. At each new line the message gets added to the messages before.
                message_final += message;
                return true;
        }
    }/// check if the index is 4 and all steps are done succesfully - if yes set the server status to "ready of execute" and return true
    else if(index == 4){
        statusMessage = EXECUTEPENDING;
        return false;
    }else{
        ///if something went wront in the steps above - return false and give the client the information about invalid input.
        statusMessage = "Invalid Input - Operation cancelled!";
        return false;
    }
}